

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O1

long proto2num(Configurable *config,long *val,char *str)

{
  sprotos *psVar1;
  int iVar2;
  byte *first;
  ushort **ppuVar3;
  ulong uVar4;
  long lVar5;
  sprotos *psVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  char *local_48;
  
  lVar5 = 1;
  if ((str != (char *)0x0) && (local_48 = strdup(str), local_48 != (char *)0x0)) {
    first = (byte *)strtok(local_48,",");
    if (first != (byte *)0x0) {
      ppuVar3 = __ctype_b_loc();
      do {
        uVar4 = (ulong)*first;
        iVar7 = 0;
        bVar8 = ((*ppuVar3)[uVar4] & 8) == 0;
        while (bVar8) {
          if ((char)uVar4 == '+') {
            iVar7 = 0;
          }
          else {
            iVar7 = 2;
            if ((int)uVar4 != 0x3d) {
              if ((int)uVar4 != 0x2d) {
                if (local_48 != (char *)0x0) {
                  free(local_48);
                }
                local_48 = (char *)0x0;
                goto LAB_00110de6;
              }
              iVar7 = 1;
            }
          }
          first = first + 1;
          uVar4 = (ulong)*first;
          bVar8 = ((*ppuVar3)[uVar4] & 8) == 0;
        }
        iVar2 = Curl_raw_equal((char *)first,"all");
        if (iVar2 == 0) {
          psVar6 = proto2num::protos;
          do {
            psVar1 = psVar6 + 1;
            bVar9 = psVar1->name == (char *)0x0;
            if (bVar9) goto LAB_00110dc3;
            psVar6 = psVar6 + 1;
            iVar2 = Curl_raw_equal((char *)first,psVar1->name);
          } while (iVar2 == 0);
        }
        else {
          bVar9 = false;
          psVar6 = proto2num::protos;
        }
        uVar4 = psVar6->bit;
        if (iVar7 == 0) {
          uVar4 = uVar4 | *val;
        }
        else if (iVar7 != 2) {
          uVar4 = ~uVar4 & *val;
        }
        *val = uVar4;
        if (bVar9) {
LAB_00110dc3:
          if (iVar7 == 2) {
            *val = 0;
          }
          warnf(config,"unrecognized protocol \'%s\'\n",first);
        }
LAB_00110de6:
        if (bVar8) {
          return 1;
        }
        first = (byte *)strtok((char *)0x0,",");
      } while (first != (byte *)0x0);
    }
    if (local_48 != (char *)0x0) {
      free(local_48);
    }
    lVar5 = 0;
  }
  return lVar5;
}

Assistant:

long proto2num(struct Configurable *config, long *val, const char *str)
{
  char *buffer;
  const char *sep = ",";
  char *token;

  static struct sprotos {
    const char *name;
    long bit;
  } const protos[] = {
    { "all", CURLPROTO_ALL },
    { "http", CURLPROTO_HTTP },
    { "https", CURLPROTO_HTTPS },
    { "ftp", CURLPROTO_FTP },
    { "ftps", CURLPROTO_FTPS },
    { "scp", CURLPROTO_SCP },
    { "sftp", CURLPROTO_SFTP },
    { "telnet", CURLPROTO_TELNET },
    { "ldap", CURLPROTO_LDAP },
    { "ldaps", CURLPROTO_LDAPS },
    { "dict", CURLPROTO_DICT },
    { "file", CURLPROTO_FILE },
    { "tftp", CURLPROTO_TFTP },
    { "imap", CURLPROTO_IMAP },
    { "imaps", CURLPROTO_IMAPS },
    { "pop3", CURLPROTO_POP3 },
    { "pop3s", CURLPROTO_POP3S },
    { "smtp", CURLPROTO_SMTP },
    { "smtps", CURLPROTO_SMTPS },
    { "rtsp", CURLPROTO_RTSP },
    { "gopher", CURLPROTO_GOPHER },
    { NULL, 0 }
  };

  if(!str)
    return 1;

  buffer = strdup(str); /* because strtok corrupts it */
  if(!buffer)
    return 1;

  for(token = strtok(buffer, sep);
      token;
      token = strtok(NULL, sep)) {
    enum e_action { allow, deny, set } action = allow;

    struct sprotos const *pp;

    /* Process token modifiers */
    while(!ISALNUM(*token)) { /* may be NULL if token is all modifiers */
      switch (*token++) {
      case '=':
        action = set;
        break;
      case '-':
        action = deny;
        break;
      case '+':
        action = allow;
        break;
      default: /* Includes case of terminating NULL */
        Curl_safefree(buffer);
        return 1;
      }
    }

    for(pp=protos; pp->name; pp++) {
      if(curlx_raw_equal(token, pp->name)) {
        switch (action) {
        case deny:
          *val &= ~(pp->bit);
          break;
        case allow:
          *val |= pp->bit;
          break;
        case set:
          *val = pp->bit;
          break;
        }
        break;
      }
    }

    if(!(pp->name)) { /* unknown protocol */
      /* If they have specified only this protocol, we say treat it as
         if no protocols are allowed */
      if(action == set)
        *val = 0;
      warnf(config, "unrecognized protocol '%s'\n", token);
    }
  }
  Curl_safefree(buffer);
  return 0;
}